

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementGeneric.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementGeneric::EleIntLoadResidual_F_gravity
          (ChElementGeneric *this,ChVectorDynamic<> *R,ChVector<double> *G_acc,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  char cVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  ChVectorDynamic<> mFg;
  int local_70;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  double local_48;
  
  local_48 = c;
  iVar13 = (*(this->super_ChElementBase)._vptr_ChElementBase[3])();
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_68,(long)iVar13);
  (*(this->super_ChElementBase)._vptr_ChElementBase[0xb])(this,&local_68,G_acc);
  if (local_68.m_storage.m_rows < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar15 = local_68.m_storage.m_rows & 0x7ffffffffffffff8;
  if (7 < (ulong)local_68.m_storage.m_rows) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_48;
    auVar19 = vbroadcastsd_avx512f(auVar1);
    uVar17 = 0;
    do {
      auVar20 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])(local_68.m_storage.m_data + uVar17));
      *(undefined1 (*) [64])(local_68.m_storage.m_data + uVar17) = auVar20;
      uVar17 = uVar17 + 8;
    } while (uVar17 < uVar15);
  }
  if ((long)uVar15 < local_68.m_storage.m_rows) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_48;
    auVar19 = vbroadcastsd_avx512f(auVar2);
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = vpbroadcastq_avx512f();
    uVar17 = 0;
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar11 = vpcmpuq_avx512f(auVar22,auVar21,2);
      pdVar3 = local_68.m_storage.m_data + uVar15 + uVar17;
      auVar22._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * (long)pdVar3[1];
      auVar22._0_8_ = (ulong)((byte)uVar11 & 1) * (long)*pdVar3;
      auVar22._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * (long)pdVar3[2];
      auVar22._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * (long)pdVar3[3];
      auVar22._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * (long)pdVar3[4];
      auVar22._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * (long)pdVar3[5];
      auVar22._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * (long)pdVar3[6];
      auVar22._56_8_ = (uVar11 >> 7) * (long)pdVar3[7];
      auVar22 = vmulpd_avx512f(auVar22,auVar19);
      pdVar3 = local_68.m_storage.m_data + uVar15 + uVar17;
      bVar4 = (bool)((byte)uVar11 & 1);
      bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
      *pdVar3 = (double)((ulong)bVar4 * auVar22._0_8_ | (ulong)!bVar4 * (long)*pdVar3);
      pdVar3[1] = (double)((ulong)bVar5 * auVar22._8_8_ | (ulong)!bVar5 * (long)pdVar3[1]);
      pdVar3[2] = (double)((ulong)bVar6 * auVar22._16_8_ | (ulong)!bVar6 * (long)pdVar3[2]);
      pdVar3[3] = (double)((ulong)bVar7 * auVar22._24_8_ | (ulong)!bVar7 * (long)pdVar3[3]);
      pdVar3[4] = (double)((ulong)bVar8 * auVar22._32_8_ | (ulong)!bVar8 * (long)pdVar3[4]);
      pdVar3[5] = (double)((ulong)bVar9 * auVar22._40_8_ | (ulong)!bVar9 * (long)pdVar3[5]);
      pdVar3[6] = (double)((ulong)bVar10 * auVar22._48_8_ | (ulong)!bVar10 * (long)pdVar3[6]);
      pdVar3[7] = (double)((uVar11 >> 7) * auVar22._56_8_ |
                          (ulong)!SUB81(uVar11 >> 7,0) * (long)pdVar3[7]);
      uVar17 = uVar17 + 8;
    } while ((((uint)local_68.m_storage.m_rows & 7) + 7 & 0xfffffff8) != uVar17);
  }
  uVar16 = 0;
  local_70 = 0;
  do {
    iVar13 = (*(this->super_ChElementBase)._vptr_ChElementBase[2])(this);
    if (iVar13 <= (int)uVar16) {
      if (local_68.m_storage.m_data != (double *)0x0) {
        free((void *)local_68.m_storage.m_data[-1]);
      }
      return;
    }
    uVar14 = (*(this->super_ChElementBase)._vptr_ChElementBase[4])(this,(ulong)uVar16);
    (*(this->super_ChElementBase)._vptr_ChElementBase[5])(&local_58,this,(ulong)uVar16);
    cVar12 = (**(code **)(*local_58 + 0x18))();
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    if (0 < (int)uVar14 && cVar12 == '\0') {
      lVar18 = (long)local_70;
      uVar15 = (ulong)uVar14;
      iVar13 = 0;
      do {
        if ((local_70 < 0) || (local_68.m_storage.m_rows <= lVar18)) {
LAB_00695581:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        local_48 = local_68.m_storage.m_data[lVar18];
        (*(this->super_ChElementBase)._vptr_ChElementBase[5])(&local_58,this,(ulong)uVar16);
        uVar17 = (ulong)(uint)(*(int *)((long)local_58 + *(long *)(*local_58 + -0x18) + 0xc) +
                              iVar13);
        if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)uVar17) goto LAB_00695581;
        pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        pdVar3[uVar17] = local_48 + pdVar3[uVar17];
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        }
        iVar13 = iVar13 + 1;
        lVar18 = lVar18 + 1;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
    uVar16 = uVar16 + 1;
    local_70 = local_70 + uVar14;
  } while( true );
}

Assistant:

void ChElementGeneric::EleIntLoadResidual_F_gravity(ChVectorDynamic<>& R, const ChVector<>& G_acc, const double c) {
    
    ChVectorDynamic<> mFg(this->GetNdofs());
    this->ComputeGravityForces(mFg, G_acc);
    mFg *= c;


    int stride = 0;
    for (int in = 0; in < this->GetNnodes(); in++) {
        int nodedofs = GetNodeNdofs(in);
        if (!GetNodeN(in)->GetFixed()) {
            for (int j = 0; j < nodedofs; j++)
                //// ATOMIC as called from an OMP parallel loop: this is here to avoid race conditions when writing to R
                #pragma omp atomic  
                R(GetNodeN(in)->NodeGetOffset_w() + j) += mFg(stride + j);
        }
        stride += nodedofs;
    }

}